

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckFormControls(TidyDocImpl *doc,Node *node)

{
  Node *node_local;
  TidyDocImpl *doc_local;
  
  if (((doc->access).HasValidFor == no) && ((doc->access).HasValidId != no)) {
    prvTidyReportAccessError(doc,node,0x302);
  }
  if (((doc->access).HasValidId == no) && ((doc->access).HasValidFor != no)) {
    prvTidyReportAccessError(doc,node,0x303);
  }
  if (((doc->access).HasValidId == no) && ((doc->access).HasValidFor == no)) {
    prvTidyReportAccessError(doc,node,0x301);
  }
  return;
}

Assistant:

static void CheckFormControls( TidyDocImpl* doc, Node* node )
{
    if ( !doc->access.HasValidFor &&
         doc->access.HasValidId )
    {
        TY_(ReportAccessError)( doc, node, ASSOCIATE_LABELS_EXPLICITLY_FOR);
    }    

    if ( !doc->access.HasValidId &&
         doc->access.HasValidFor )
    {
        TY_(ReportAccessError)( doc, node, ASSOCIATE_LABELS_EXPLICITLY_ID);
    }

    if ( !doc->access.HasValidId &&
         !doc->access.HasValidFor )
    {
        TY_(ReportAccessError)( doc, node, ASSOCIATE_LABELS_EXPLICITLY);
    }
}